

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdGetAddressInfo(void *handle,char *address,int *network_type,int *hash_type,
                     int *witness_version,char **locking_script,char **hash)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  NetType NVar4;
  AddressType AVar5;
  WitnessVersion WVar6;
  undefined8 uVar7;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  string *in_RSI;
  WitnessVersion *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  AddressFactory factory_1;
  string err_msg;
  CfdException *cfd_except;
  ElementsAddressFactory factory;
  Address addr;
  char *work_hash;
  char *work_locking_script;
  int error_code;
  Address *in_stack_fffffffffffff858;
  Address *in_stack_fffffffffffff860;
  AddressFactory *in_stack_fffffffffffff868;
  string *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  CfdError error_code_00;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  ElementsAddressFactory *in_stack_fffffffffffff890;
  allocator *paVar8;
  string *in_stack_fffffffffffff8c0;
  ByteData local_6d0;
  string local_6b8;
  Script local_698;
  string local_660;
  undefined1 local_63a;
  allocator local_639;
  string local_638 [36];
  AddressType local_614;
  CfdSourceLocation local_610;
  allocator local_5f1;
  string local_5f0 [32];
  Address local_5d0;
  string local_430 [2];
  allocator local_3d9;
  string local_3d8 [32];
  Address local_3b8;
  Address local_218;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  WitnessVersion *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  string *local_18;
  int local_4;
  
  error_code_00 = (CfdError)((ulong)in_stack_fffffffffffff878 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString((char *)local_18);
  if (!bVar2) {
    cfd::core::Address::Address(&local_218);
    cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff890);
    psVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d8,(char *)psVar1,&local_3d9);
    cfd::AddressFactory::GetAddress(in_stack_fffffffffffff868,(string *)in_stack_fffffffffffff860);
    cfd::core::Address::operator=(&local_218,&local_3b8);
    cfd::core::Address::~Address(in_stack_fffffffffffff860);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5865a3);
    cfd::core::Address::GetAddress_abi_cxx11_(local_430,&local_218);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)local_430);
    if ((bVar3 & 1) != 0) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)0x586820);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,(char *)local_18,&local_5f1);
      cfd::AddressFactory::GetAddress(in_stack_fffffffffffff868,(string *)in_stack_fffffffffffff860)
      ;
      cfd::core::Address::operator=(&local_218,&local_5d0);
      cfd::core::Address::~Address(in_stack_fffffffffffff860);
      std::__cxx11::string::~string(local_5f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x5868c4);
      in_stack_fffffffffffff8c0 = local_18;
    }
    if (local_20 != (undefined4 *)0x0) {
      NVar4 = cfd::core::Address::GetNetType(&local_218);
      switch(NVar4) {
      case kMainnet:
        *local_20 = 0;
        break;
      case kTestnet:
        *local_20 = 1;
        break;
      case kRegtest:
        *local_20 = 2;
        break;
      case kLiquidV1:
        *local_20 = 10;
        break;
      case kElementsRegtest:
        *local_20 = 0xb;
        break;
      default:
        *local_20 = 0xc;
      }
    }
    if (local_28 != (undefined4 *)0x0) {
      AVar5 = cfd::core::Address::GetAddressType(&local_218);
      switch(AVar5) {
      case kP2shAddress:
        *local_28 = 1;
        break;
      case kP2pkhAddress:
        *local_28 = 2;
        break;
      case kP2wshAddress:
        *local_28 = 3;
        break;
      case kP2wpkhAddress:
        *local_28 = 4;
        break;
      case kP2shP2wshAddress:
        *local_28 = 5;
        break;
      case kP2shP2wpkhAddress:
        *local_28 = 6;
        break;
      case kTaprootAddress:
        *local_28 = 7;
        break;
      case kWitnessUnknown:
        *local_28 = 0xff;
        break;
      default:
        local_610.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                     ,0x2f);
        local_610.filename = local_610.filename + 1;
        local_610.line = 0x481;
        local_610.funcname = "CfdGetAddressInfo";
        local_614 = cfd::core::Address::GetAddressType(&local_218);
        cfd::core::logger::warn<cfd::core::AddressType>
                  (&local_610,"Illegal hash type.({})",&local_614);
        local_63a = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        paVar8 = &local_639;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_638,"Illegal hash type.",paVar8);
        cfd::core::CfdException::CfdException
                  ((CfdException *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   error_code_00,in_stack_fffffffffffff870);
        local_63a = 0;
        __cxa_throw(uVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
    }
    if (local_30 != (WitnessVersion *)0x0) {
      WVar6 = cfd::core::Address::GetWitnessVersion(&local_218);
      *local_30 = WVar6;
    }
    cfd::core::Address::GetLockingScript(&local_698,&local_218);
    cfd::core::Script::GetHex_abi_cxx11_(&local_660,&local_698);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string((string *)&local_660);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff860);
    cfd::core::Address::GetHash(in_stack_fffffffffffff858);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_6b8,&local_6d0);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string((string *)&local_6b8);
    cfd::core::ByteData::~ByteData((ByteData *)0x586d55);
    if (local_38 != (undefined8 *)0x0) {
      *local_38 = local_48;
    }
    if (in_stack_00000008 != (undefined8 *)0x0) {
      *in_stack_00000008 = local_50;
    }
    local_4 = 0;
    cfd::core::Address::~Address(in_stack_fffffffffffff860);
    return local_4;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x435;
  local_78.funcname = "CfdGetAddressInfo";
  cfd::core::logger::warn<>(&local_78,"address is null.");
  local_9a = 1;
  uVar7 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Failed to parameter. address is null.",&local_99);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
             error_code_00,in_stack_fffffffffffff870);
  local_9a = 0;
  __cxa_throw(uVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetAddressInfo(
    void* handle, const char* address, int* network_type, int* hash_type,
    int* witness_version, char** locking_script, char** hash) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    Address addr;
#ifndef CFD_DISABLE_ELEMENTS
    try {
      ElementsAddressFactory factory;
      addr = factory.GetAddress(address);
    } catch (const CfdException& cfd_except) {
      std::string err_msg = cfd_except.what();
      if ((err_msg != "Base58 decode error.") &&
          (err_msg != "Unknown address prefix.")) {
        throw cfd_except;
      }
    }
#endif  // CFD_DISABLE_ELEMENTS

    if (addr.GetAddress().empty()) {
      AddressFactory factory;
      addr = factory.GetAddress(address);
    }

    if (network_type != nullptr) {
      switch (addr.GetNetType()) {
        case NetType::kMainnet:
          *network_type = kCfdNetworkMainnet;
          break;
        case NetType::kTestnet:
          *network_type = kCfdNetworkTestnet;
          break;
        case NetType::kRegtest:
          *network_type = kCfdNetworkRegtest;
          break;
        case NetType::kLiquidV1:
          *network_type = kCfdNetworkLiquidv1;
          break;
        case NetType::kElementsRegtest:
          *network_type = kCfdNetworkElementsRegtest;
          break;
        default:
          *network_type = kCfdNetworkCustomChain;
          break;
      }
    }

    if (hash_type != nullptr) {
      switch (addr.GetAddressType()) {
        case AddressType::kP2shAddress:
          *hash_type = kCfdP2sh;
          break;
        case AddressType::kP2pkhAddress:
          *hash_type = kCfdP2pkh;
          break;
        case AddressType::kP2wshAddress:
          *hash_type = kCfdP2wsh;
          break;
        case AddressType::kP2wpkhAddress:
          *hash_type = kCfdP2wpkh;
          break;
        case AddressType::kP2shP2wshAddress:
          *hash_type = kCfdP2shP2wsh;
          break;
        case AddressType::kP2shP2wpkhAddress:
          *hash_type = kCfdP2shP2wpkh;
          break;
        case AddressType::kTaprootAddress:
          *hash_type = kCfdTaproot;
          break;
        case AddressType::kWitnessUnknown:
          *hash_type = kCfdUnknown;
          break;
        default:
          warn(
              CFD_LOG_SOURCE, "Illegal hash type.({})", addr.GetAddressType());
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Illegal hash type.");
      }
    }

    if (witness_version != nullptr) {
      *witness_version = static_cast<int>(addr.GetWitnessVersion());
    }
    work_locking_script = CreateString(addr.GetLockingScript().GetHex());
    work_hash = CreateString(addr.GetHash().GetHex());

    if (locking_script != nullptr) {
      *locking_script = work_locking_script;
    }
    if (hash != nullptr) {
      *hash = work_hash;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_locking_script, &work_hash);
  return error_code;
}